

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TilePool.test.cpp
# Opt level: O0

TileData *
setTileInPool<tiles::Input>
          (TilePool *pool,size_t sectorId,uint offset,TileData expected,Input *tileType,t tileId)

{
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  undefined4 uVar1;
  TileData *pTVar2;
  ExprLhs<const_TileData_&> this;
  ExprLhs<const_TileId::t_&> rhs;
  AssertionHandler catchAssertionHandler_1;
  AssertionHandler catchAssertionHandler;
  TileData result;
  undefined4 in_stack_fffffffffffffdd8;
  Flags in_stack_fffffffffffffddc;
  AssertionHandler *in_stack_fffffffffffffde0;
  AssertionHandler *this_00;
  StringRef *in_stack_fffffffffffffde8;
  AssertionHandler *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  SourceLineInfo *this_01;
  undefined6 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe0e;
  undefined1 in_stack_fffffffffffffe0f;
  TilePool *in_stack_fffffffffffffe10;
  ExprLhs<const_TileData_&> *in_stack_fffffffffffffe18;
  AssertionHandler local_1a8 [2];
  undefined4 local_e6;
  TileData *local_e0;
  SourceLineInfo local_98;
  StringRef local_88;
  uint local_4;
  
  local_88 = operator____catch_sr
                       ((char *)in_stack_fffffffffffffde0,
                        CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  this_01 = &local_98;
  Catch::SourceLineInfo::SourceLineInfo
            (this_01,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/tdepke2[P]CircuitSim2/tests/TilePool.test.cpp"
             ,0x16);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8);
  capturedExpression.m_start._4_4_ = in_stack_fffffffffffffdfc;
  capturedExpression.m_start._0_4_ = in_stack_fffffffffffffdf8;
  capturedExpression.m_size._0_4_ = (int)this_01;
  capturedExpression.m_size._4_4_ = (int)((ulong)this_01 >> 0x20);
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
             (SourceLineInfo *)in_stack_fffffffffffffde0,capturedExpression,
             in_stack_fffffffffffffddc);
  TilePool::accessTile
            (in_stack_fffffffffffffe10,
             CONCAT17(in_stack_fffffffffffffe0f,
                      CONCAT16(in_stack_fffffffffffffe0e,in_stack_fffffffffffffe08)),
             (uint)((ulong)this_01 >> 0x20));
  pTVar2 = Tile::getRawData((Tile *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  uVar1 = SUB84(pTVar2,0);
  local_e6 = uVar1;
  this = Catch::Decomposer::operator<=
                   ((Decomposer *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                    (TileData *)0x268c23);
  local_e0 = this.m_lhs;
  Catch::ExprLhs<TileData_const&>::operator==
            (in_stack_fffffffffffffe18,(TileData *)in_stack_fffffffffffffe10);
  Catch::AssertionHandler::handleExpr
            (in_stack_fffffffffffffde0,
             (ITransientExpression *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  Catch::BinaryExpr<const_TileData_&,_const_TileData_&>::~BinaryExpr
            ((BinaryExpr<const_TileData_&,_const_TileData_&> *)0x268c7a);
  Catch::AssertionHandler::complete(in_stack_fffffffffffffde0);
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffde0);
  TilePool::accessTile
            (in_stack_fffffffffffffe10,
             CONCAT17(in_stack_fffffffffffffe0f,
                      CONCAT16(in_stack_fffffffffffffe0e,in_stack_fffffffffffffe08)),
             (uint)((ulong)this_01 >> 0x20));
  Tile::setType((Tile *)this.m_lhs,(Input *)in_stack_fffffffffffffde8,
                (t)((ulong)in_stack_fffffffffffffde0 >> 0x38),
                (t)((ulong)in_stack_fffffffffffffde0 >> 0x30),
                (char)((ulong)in_stack_fffffffffffffde0 >> 0x28));
  TilePool::accessTile
            (in_stack_fffffffffffffe10,
             CONCAT17(in_stack_fffffffffffffe0f,
                      CONCAT16(in_stack_fffffffffffffe0e,in_stack_fffffffffffffe08)),
             (uint)((ulong)this_01 >> 0x20));
  pTVar2 = Tile::getRawData((Tile *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  local_4 = (uint)pTVar2;
  local_1a8[0].m_assertionInfo.lineInfo =
       (SourceLineInfo)
       operator____catch_sr
                 ((char *)in_stack_fffffffffffffde0,
                  CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  this_00 = local_1a8;
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)this_00,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/tdepke2[P]CircuitSim2/tests/TilePool.test.cpp"
             ,0x19);
  Catch::StringRef::StringRef((StringRef *)this.m_lhs,(char *)in_stack_fffffffffffffde8);
  capturedExpression_00.m_start._4_4_ = uVar1;
  capturedExpression_00.m_start._0_4_ = in_stack_fffffffffffffdf8;
  capturedExpression_00.m_size._0_4_ = (int)this_01;
  capturedExpression_00.m_size._4_4_ = (int)((ulong)this_01 >> 0x20);
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)this.m_lhs,in_stack_fffffffffffffde8,(SourceLineInfo *)this_00,
             capturedExpression_00,in_stack_fffffffffffffddc);
  rhs = Catch::Decomposer::operator<=
                  ((Decomposer *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                   (t *)0x268e0e);
  Catch::ExprLhs<TileId::t_const&>::operator==
            ((ExprLhs<const_TileId::t_&> *)in_stack_fffffffffffffe18,rhs.m_lhs);
  Catch::AssertionHandler::handleExpr
            (this_00,(ITransientExpression *)
                     CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  Catch::BinaryExpr<const_TileId::t_&,_const_TileId::t_&>::~BinaryExpr
            ((BinaryExpr<const_TileId::t_&,_const_TileId::t_&> *)0x268e56);
  Catch::AssertionHandler::complete(this_00);
  Catch::AssertionHandler::~AssertionHandler(this_00);
  return (TileData *)(ulong)local_4;
}

Assistant:

TileData setTileInPool(TilePool& pool, size_t sectorId, unsigned int offset, TileData expected, T* tileType, TileId::t tileId) {
    REQUIRE(pool.accessTile(sectorId, offset).getRawData() == expected);
    pool.accessTile(sectorId, offset).setType(tileType, tileId);
    TileData result = pool.accessTile(sectorId, offset).getRawData();
    REQUIRE(result.id == tileId);
    return result;
}